

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

void SSTable::toSSTable(SSTableDic *dic,string *fileName,uint64_t timeStamp)

{
  pointer ppVar1;
  uint64_t n;
  uint64_t n_00;
  runtime_error *this;
  size_t __n;
  void *__buf;
  SSTableDic *__range1;
  uint32_t n_01;
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair_1;
  pointer ppVar2;
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a50;
  ofstream out;
  byte abStack_2a10 [480];
  BloomFilter bloomFilter;
  
  std::ofstream::ofstream(&out,(string *)fileName,_S_trunc|_S_out|_S_bin);
  if ((abStack_2a10[*(long *)(_out + -0x18)] & 5) == 0) {
    ppVar2 = (dic->
             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (dic->
             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    n = ppVar2->first;
    n_00 = ppVar1[-1].first;
    write64(&out,timeStamp);
    __n = 0x28;
    write64(&out,((long)ppVar1 - (long)ppVar2) / 0x28);
    write64(&out,n);
    write64(&out,n_00);
    BloomFilter::BloomFilter(&bloomFilter,dic);
    BloomFilter::write(&bloomFilter,(int)&out,__buf,__n);
    ppVar1 = (dic->
             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    n_01 = 0;
    for (ppVar2 = (dic->
                  super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1)
    {
      write64(&out,ppVar2->first);
      write32(&out,n_01);
      n_01 = n_01 + (int)(ppVar2->second)._M_string_length;
    }
    write64(&out,0);
    write32(&out,n_01);
    ppVar1 = (dic->
             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar2 = (dic->
                  super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1)
    {
      std::ostream::write((char *)&out,(long)(ppVar2->second)._M_dataplus._M_p);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&out);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_2a50,"toSSTable(dic): Open file ",fileName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bloomFilter,
                 &local_2a50," failed!");
  std::runtime_error::runtime_error(this,(string *)&bloomFilter);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SSTable::toSSTable(const SSTableDic &dic, const string &fileName,
                        uint64_t timeStamp) {
  ofstream out(fileName, ios::out | ios::binary | ios::trunc);
  if (out.fail())
    throw runtime_error("toSSTable(dic): Open file " + fileName + " failed!");

  auto length = dic.size();
  auto min = dic[0].first;
  auto max = dic.back().first;

  // Header
  write64(out, timeStamp);
  write64(out, length);
  write64(out, min);
  write64(out, max);

  // BloomFilter
  BloomFilter bloomFilter(dic);
  bloomFilter.write(out);

  // Key, Offset
  uint32_t offset = 0;
  for (const auto &pair : dic) {
    write64(out, pair.first);
    write32(out, offset);
    offset += pair.second.size();
  }
  write64(out, 0);
  write32(out, offset);

  // Value
  for (const auto &pair : dic) {
    out.write(pair.second.c_str(), (long)pair.second.size());
  }

  out.close();
}